

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O2

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,IfStatement *ptr)

{
  SubtreeWrapper *pSVar1;
  int iVar2;
  LabelStatement *this_00;
  LabelStatement *this_01;
  SeqStatement *pSVar3;
  undefined4 extraout_var;
  StatementWrapper *this_02;
  Statement *first;
  string *psVar4;
  undefined1 local_110 [8];
  Label label_true;
  Label local_d0;
  string local_b0 [32];
  string local_90 [32];
  undefined1 local_70 [8];
  Label label_join;
  LabelStatement *local_38;
  
  (**(ptr->condition->super_Base)._vptr_Base)(ptr->condition,this);
  label_join.label_.field_2._8_8_ = this->curr_wrapper;
  (**(ptr->do_if_true->super_Base)._vptr_Base)(ptr->do_if_true,this);
  pSVar1 = this->curr_wrapper;
  IRT::Label::Label((Label *)local_110);
  IRT::Label::Label((Label *)local_70);
  local_38 = (LabelStatement *)operator_new(0x28);
  psVar4 = (string *)local_70;
  std::__cxx11::string::string((string *)(label_true.label_.field_2._M_local_buf + 8),psVar4);
  IRT::LabelStatement::LabelStatement(local_38,(Label *)((long)&label_true.label_.field_2 + 8));
  std::__cxx11::string::~string((string *)(label_true.label_.field_2._M_local_buf + 8));
  if (pSVar1 != (SubtreeWrapper *)0x0) {
    this_00 = (LabelStatement *)operator_new(0x18);
    this_01 = (LabelStatement *)operator_new(0x28);
    psVar4 = (string *)local_110;
    std::__cxx11::string::string((string *)&local_d0,psVar4);
    IRT::LabelStatement::LabelStatement(this_01,&local_d0);
    pSVar3 = (SeqStatement *)operator_new(0x18);
    iVar2 = (*pSVar1->_vptr_SubtreeWrapper[3])(pSVar1);
    IRT::SeqStatement::SeqStatement
              (pSVar3,(Statement *)CONCAT44(extraout_var,iVar2),(Statement *)local_38);
    IRT::SeqStatement::SeqStatement
              ((SeqStatement *)this_00,(Statement *)this_01,(Statement *)pSVar3);
    std::__cxx11::string::~string((string *)&local_d0);
    local_38 = this_00;
  }
  this_02 = (StatementWrapper *)operator_new(0x10);
  pSVar3 = (SeqStatement *)operator_new(0x18);
  std::__cxx11::string::string(local_b0,psVar4);
  std::__cxx11::string::string(local_90,(string *)local_70);
  first = (Statement *)
          (**(code **)(*(long *)label_join.label_.field_2._8_8_ + 0x20))
                    (label_join.label_.field_2._8_8_,local_b0,local_90);
  IRT::SeqStatement::SeqStatement(pSVar3,first,&local_38->super_Statement);
  IRT::StatementWrapper::StatementWrapper(this_02,(Statement *)pSVar3);
  this->curr_wrapper = (SubtreeWrapper *)this_02;
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_110);
  return;
}

Assistant:

void ir_tree_visitor::visit(IfStatement* ptr) {
    ptr->condition->accept(this);
    auto condition = curr_wrapper;
    ptr->do_if_true->accept(this);
    auto true_branch = curr_wrapper;

    IRT::Label label_true;
    IRT::Label label_join;
    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;

    if (true_branch) {
        result_true = &label_true;
        suffix = new IRT::SeqStatement(
            new IRT::LabelStatement(label_true),
            new IRT::SeqStatement(true_branch->ToStatement(), suffix)
        );
    }

    curr_wrapper = new IRT::StatementWrapper(
            new IRT::SeqStatement(
                condition->ToConditional(*result_true, label_join),
                suffix
            )
    );
}